

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  bool bVar6;
  pointer pbVar7;
  bool bVar8;
  string les;
  string local_name;
  undefined1 local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string *local_138;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  long local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  local_138 = name_to_check;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->name_)._M_string_length);
  if (this->ignore_underscore_ == true) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_d0._M_current = &local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + (this->name_)._M_string_length);
    local_110._M_dataplus._M_p._0_1_ = 0x5f;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_d0,local_d0._M_current + local_c8,
                       (_Iter_equals_val<const_char>)&local_110);
    local_158._M_string_length = (long)_Var5._M_current - (long)local_d0._M_current;
    *_Var5._M_current = '\0';
    paVar1 = &local_158.field_2;
    if (local_d0._M_current == &local_c0) {
      local_158.field_2._8_8_ = uStack_b8;
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158._M_dataplus._M_p = local_d0._M_current;
    }
    local_158.field_2._M_allocated_capacity._1_7_ = uStack_bf;
    local_158.field_2._M_local_buf[0] = local_c0;
    local_c8 = 0;
    local_c0 = '\0';
    local_d0._M_current = &local_c0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_50,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._M_current != &local_c0) {
      operator_delete(local_d0._M_current,CONCAT71(uStack_bf,local_c0) + 1);
    }
    pcVar2 = (local_138->_M_dataplus)._M_p;
    local_f0._M_current = &local_e0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + local_138->_M_string_length);
    local_110._M_dataplus._M_p._0_1_ = 0x5f;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_f0,local_f0._M_current + local_e8,
                       (_Iter_equals_val<const_char>)&local_110);
    local_158._M_string_length = (long)_Var5._M_current - (long)local_f0._M_current;
    *_Var5._M_current = '\0';
    if (local_f0._M_current == &local_e0) {
      local_158.field_2._8_8_ = uStack_d8;
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158._M_dataplus._M_p = local_f0._M_current;
    }
    local_158.field_2._M_allocated_capacity._1_7_ = uStack_df;
    local_158.field_2._M_local_buf[0] = local_e0;
    local_e8 = 0;
    local_e0 = '\0';
    local_f0._M_current = &local_e0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_138,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_f0._M_current != &local_e0) {
      operator_delete(local_f0._M_current,CONCAT71(uStack_df,local_e0) + 1);
    }
  }
  if (this->ignore_case_ == true) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_70 = &local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_70,local_70->_M_local_buf + local_68,local_70);
    paVar1 = &local_158.field_2;
    if (local_70 == &local_60) {
      local_158.field_2._8_8_ = local_60._8_8_;
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158._M_dataplus._M_p = (pointer)local_70;
    }
    local_158.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
    local_158.field_2._M_local_buf[0] = local_60._M_local_buf[0];
    local_158._M_string_length = local_68;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_70 = &local_60;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_50,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                        local_60._M_local_buf[0]) + 1);
    }
    pcVar2 = (local_138->_M_dataplus)._M_p;
    local_90 = &local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + local_138->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_90,local_90->_M_local_buf + local_88,local_90);
    if (local_90 == &local_80) {
      local_158.field_2._8_8_ = local_80._8_8_;
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158._M_dataplus._M_p = (pointer)local_90;
    }
    local_158.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_158.field_2._M_local_buf[0] = local_80._M_local_buf[0];
    local_158._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = &local_80;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_138,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                        local_80._M_local_buf[0]) + 1);
    }
  }
  if ((local_50._M_string_length != local_138->_M_string_length) ||
     ((bVar6 = true, local_50._M_string_length != 0 &&
      (iVar4 = bcmp(local_50._M_dataplus._M_p,(local_138->_M_dataplus)._M_p,
                    local_50._M_string_length), iVar4 != 0)))) {
    pbVar3 = (this->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (this->aliases_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar6 = pbVar7 != pbVar3, bVar6;
        pbVar7 = pbVar7 + 1) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar2,pcVar2 + pbVar7->_M_string_length);
      if (this->ignore_underscore_ == true) {
        local_130._M_current = &local_120;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        local_159 = 0x5f;
        _Var5 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_130,local_130._M_current + local_128,
                           (_Iter_equals_val<const_char>)&local_159);
        local_110._M_string_length = (long)_Var5._M_current - (long)local_130._M_current;
        *_Var5._M_current = '\0';
        if (local_130._M_current == &local_120) {
          local_110.field_2._8_8_ = uStack_118;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110._M_dataplus._M_p = local_130._M_current;
        }
        local_110.field_2._M_allocated_capacity._1_7_ = uStack_11f;
        local_110.field_2._M_local_buf[0] = local_120;
        local_128 = 0;
        local_120 = '\0';
        local_130._M_current = &local_120;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_158,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_130._M_current != &local_120) {
          operator_delete(local_130._M_current,CONCAT71(uStack_11f,local_120) + 1);
        }
      }
      if (this->ignore_case_ == true) {
        local_b0 = &local_a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_b0,local_b0->_M_local_buf + local_a8,local_b0);
        if (local_b0 == &local_a0) {
          local_110.field_2._8_8_ = local_a0._8_8_;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110._M_dataplus._M_p = (pointer)local_b0;
        }
        local_110.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
        local_110.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
        local_110._M_string_length = local_a8;
        local_a8 = 0;
        local_a0._M_local_buf[0] = '\0';
        local_b0 = &local_a0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_158,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                            local_a0._M_local_buf[0]) + 1);
        }
      }
      if (local_158._M_string_length == local_138->_M_string_length) {
        if (local_158._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar4 = bcmp(local_158._M_dataplus._M_p,(local_138->_M_dataplus)._M_p,
                       local_158._M_string_length);
          bVar8 = iVar4 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) break;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}